

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TextureBufferFormatCase::TextureBufferFormatCase
          (TextureBufferFormatCase *this,Context *ctx,RenderContext *renderCtx,char *name,
          char *description,deUint32 internalFormat,int width)

{
  ContextType type;
  GLSLVersion glslVersion;
  TestContext *this_00;
  TestLog *log;
  deUint32 internalFormat_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  Context *ctx_local;
  TextureBufferFormatCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,ctx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBufferFormatCase_011c4fb8;
  this->m_renderCtx = renderCtx;
  this->m_format = internalFormat;
  this->m_width = width;
  this->m_maxTextureBufferSize = 0;
  this->m_texture = (TextureBuffer *)0x0;
  this_00 = Context::getTestContext(ctx);
  log = tcu::TestContext::getLog(this_00);
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,log,glslVersion,PRECISION_HIGHP);
  return;
}

Assistant:

TextureBufferFormatCase::TextureBufferFormatCase (Context& ctx, glu::RenderContext& renderCtx, const char* name, const char* description, deUint32 internalFormat, int width)
	: TestCase					(ctx, name, description)
	, m_renderCtx				(renderCtx)
	, m_format					(internalFormat)
	, m_width					(width)
	, m_maxTextureBufferSize	(0)
	, m_texture					(DE_NULL)
	, m_renderer				(renderCtx, ctx.getTestContext().getLog(), glu::getContextTypeGLSLVersion(renderCtx.getType()), glu::PRECISION_HIGHP)
{
}